

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.c
# Opt level: O2

void av1_reset_loop_restoration(MACROBLOCKD *xd,int num_planes)

{
  ulong uVar1;
  int *piVar2;
  ulong uVar3;
  
  uVar1 = 0;
  uVar3 = (ulong)(uint)num_planes;
  if (num_planes < 1) {
    uVar3 = uVar1;
  }
  piVar2 = xd->sgrproj_info[0].xqd + 1;
  for (; uVar3 * 0x20 != uVar1; uVar1 = uVar1 + 0x20) {
    *(undefined8 *)((long)xd->wiener_info[0].hfilter + uVar1) = 0xffea000ffff90003;
    *(undefined8 *)((long)xd->wiener_info[0].vfilter + uVar1) = 0xffea000ffff90003;
    *(undefined2 *)((long)xd->wiener_info[0].hfilter + uVar1 + 8) = 0xf;
    *(undefined2 *)((long)xd->wiener_info[0].vfilter + uVar1 + 8) = 0xf;
    *(undefined4 *)((long)xd->wiener_info[0].hfilter + uVar1 + 10) = 0x3fff9;
    *(undefined4 *)((long)xd->wiener_info[0].vfilter + uVar1 + 10) = 0x3fff9;
    piVar2[-1] = -0x20;
    piVar2[0] = 0x1f;
    piVar2 = piVar2 + 3;
  }
  return;
}

Assistant:

void av1_reset_loop_restoration(MACROBLOCKD *xd, const int num_planes) {
  for (int p = 0; p < num_planes; ++p) {
    set_default_wiener(xd->wiener_info + p);
    set_default_sgrproj(xd->sgrproj_info + p);
  }
}